

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawFile.cpp
# Opt level: O2

void __thiscall RawFile::RawFile(RawFile *this,string *fname,int flags,int mode)

{
  int iVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string message;
  
  iVar1 = open((fname->_M_dataplus)._M_p,flags,(ulong)(uint)mode);
  this->fd = iVar1;
  if (-1 < iVar1) {
    return;
  }
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_70,"RawFile::RawFile: open for ",fname);
  std::operator+(&local_50,&local_70," failed");
  std::__cxx11::string::append((string *)&message);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&message);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RawFile::RawFile(const std::string &fname, int flags, int mode) {
    fd = ::open(fname.c_str(), flags, mode);
    if (fd < 0) {
        std::string message;
        message += "RawFile::RawFile: open for " + fname + " failed";
        throw std::runtime_error(message);
    }
}